

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uint dict_pos;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  state *psVar11;
  uchar *puVar12;
  uchar *puVar13;
  state *psVar14;
  ulong uVar15;
  bit_cost_t bVar16;
  lzdecision *plVar17;
  lzham_malloc_context *ppvVar18;
  uint *in_RSI;
  bit_cost_t *in_RDI;
  node_state *cur_node;
  lzdecision *pDst_dec;
  int node_index;
  uint bytes_actually_parsed;
  uint lit_total_complexity;
  bit_cost_t lit_total_cost;
  bit_cost_t lit_cost;
  uint match_total_complexity_1;
  bit_cost_t match_total_cost_1;
  node_state *dst_node_2;
  uint match_complexity;
  uint l_1;
  uint match_dist;
  uint end_len;
  uint start_len;
  uint full_match_index;
  uint prev_max_match_len;
  uint match_len;
  dict_match *pMatches;
  uint min_truncate_match_len;
  uint match_total_complexity;
  bit_cost_t match_total_cost;
  node_state *dst_node_1;
  bit_cost_t cost;
  uint len2_match_dist;
  uint num_full_matches;
  uint max_match_len;
  bit_cost_t rep_match_total_cost;
  node_state *dst_node;
  uint l;
  uint rep_match_total_complexity;
  uint8 *pComp;
  uint comp_pos;
  uint dist;
  uint hist_match_len;
  uint rep_match_index;
  uint match_hist_min_match_len;
  uint match_hist_max_len;
  uint8 *pLookahead;
  uint is_match_model_index;
  uint lit_pred0;
  uint cur_node_total_complexity;
  bit_cost_t cur_node_total_cost;
  uint find_dict_size;
  uint max_admissable_match_len;
  node_state *pCur_node;
  node_state *pMax_node_in_graph;
  bit_cost_t lzdec_bitcosts [258];
  uint match_distances [128];
  uint match_lens [128];
  uint cur_node_index;
  uint cur_lookahead_ofs;
  uint cur_dict_ofs;
  uint lookahead_start_ofs;
  uint bytes_to_parse;
  state *approx_state;
  node_state *pNodes;
  uint in_stack_fffffffffffff238;
  uint in_stack_fffffffffffff23c;
  uint in_stack_fffffffffffff240;
  undefined1 grow_hint;
  uint in_stack_fffffffffffff244;
  state *in_stack_fffffffffffff248;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  undefined8 in_stack_fffffffffffff250;
  state *in_stack_fffffffffffff258;
  state *in_stack_fffffffffffff260;
  uint in_stack_fffffffffffff268;
  uint in_stack_fffffffffffff26c;
  state *in_stack_fffffffffffff270;
  state *in_stack_fffffffffffff278;
  int in_stack_fffffffffffff280;
  uint uVar19;
  CLZBase *in_stack_fffffffffffff298;
  state *in_stack_fffffffffffff2a0;
  uint in_stack_fffffffffffff2ac;
  int in_stack_fffffffffffff2b0;
  uint in_stack_fffffffffffff2b4;
  ulong in_stack_fffffffffffff2b8;
  bit_cost_t in_stack_fffffffffffff2c0;
  uint local_d1c;
  uint local_d0c;
  uint local_d08;
  dict_match *local_d00;
  uint local_cd0;
  uint local_ccc;
  uint local_cb8;
  uint local_ca0;
  uint local_c9c;
  uint local_c98;
  uint local_c94;
  state *local_c60;
  long local_c58 [258];
  uint auStack_448 [128];
  uint auStack_248 [131];
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  state_base *local_28;
  state *local_20;
  uint *local_18;
  bool local_1;
  
  *(undefined1 *)((long)in_RSI + 0x15675e) = 0;
  *(undefined1 *)(in_RSI + 0x559ca) = 1;
  local_20 = (state *)(in_RSI + 0x152);
  *(undefined2 *)(in_RSI + 0x15f) = 0xffff;
  in_RSI[0x15c] = 0;
  in_RSI[0x15d] = 0;
  in_RSI[0x15e] = 0;
  local_28 = *(state_base **)(in_RSI + 0x150);
  local_2c = in_RSI[1];
  local_18 = in_RSI;
  dict_pos = search_accelerator::get_lookahead_pos((search_accelerator *)(in_RDI + 0xf));
  uVar5 = search_accelerator::get_max_dict_size_mask((search_accelerator *)(in_RDI + 0xf));
  local_30 = dict_pos & uVar5;
  local_34 = *local_18;
  local_38 = local_34 - local_30;
  local_3c = 0;
  local_c60 = local_20;
  while ((local_3c < local_2c &&
         ((psVar11 = (state *)((long)&local_20->super_state_base + (ulong)local_3c * 0x38),
          local_3c < local_18[0x559d5] || (psVar11 != local_c60))))) {
    if (local_2c - local_3c < 0x102) {
      uVar10 = local_2c - local_3c;
    }
    else {
      uVar10 = 0x101;
    }
    uVar6 = *(int *)((long)in_RDI + 0xa4) + local_38;
    uVar19 = uVar10;
    if (local_3c != 0) {
      state_base::restore_partial_state
                (local_28,(state_base *)((long)(psVar11->super_state_base).m_match_hist + 4));
      state_base::partial_advance
                (&in_stack_fffffffffffff260->super_state_base,
                 (lzdecision *)in_stack_fffffffffffff258);
    }
    lVar3 = *(long *)(psVar11->m_is_match_model + 2);
    iVar1 = *(int *)&((vector<unsigned_char> *)(psVar11->m_is_match_model + 6))->m_p;
    state::get_pred_char
              (in_stack_fffffffffffff248,
               (search_accelerator *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
               in_stack_fffffffffffff23c,in_stack_fffffffffffff238);
    uVar2 = local_28->m_cur_state;
    puVar12 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x15),local_34);
    local_c94 = 0;
    local_c98 = 1;
    for (local_c9c = 0; local_c9c < 4; local_c9c = local_c9c + 1) {
      local_ca0 = 0;
      if (local_28->m_match_hist[local_c9c] <= uVar6) {
        puVar13 = vector<unsigned_char>::operator[]
                            ((vector<unsigned_char> *)(in_RDI + 0x15),
                             (*(int *)((long)in_RDI + 0x9c) + local_38) -
                             local_28->m_match_hist[local_c9c] & (uint)in_RDI[0x13]);
        for (local_ca0 = 0; (local_ca0 < uVar10 && (puVar13[local_ca0] == puVar12[local_ca0]));
            local_ca0 = local_ca0 + 1) {
        }
      }
      if (local_c98 <= local_ca0) {
        local_c94 = math::maximum<unsigned_int>(local_c94,local_ca0);
        in_stack_fffffffffffff238 = uVar2;
        state::get_rep_match_costs
                  ((state *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                   in_stack_fffffffffffff2ac,(bit_cost_t *)in_stack_fffffffffffff2a0,
                   (uint)((ulong)in_stack_fffffffffffff298 >> 0x20),(int)in_stack_fffffffffffff298,
                   dict_pos,(uint)in_stack_fffffffffffff2c0);
        uVar7 = iVar1 + local_c9c + 2;
        for (local_cb8 = local_c98; local_cb8 <= local_ca0; local_cb8 = local_cb8 + 1) {
          psVar14 = (state *)((long)&psVar11->super_state_base + (ulong)local_cb8 * 0x38);
          uVar15 = lVar3 + local_c58[local_cb8];
          if ((uVar15 <= *(ulong *)(psVar14->m_is_match_model + 2)) &&
             ((uVar15 != *(ulong *)(psVar14->m_is_match_model + 2) ||
              (uVar7 < *(uint *)&((vector<unsigned_char> *)(psVar14->m_is_match_model + 6))->m_p))))
          {
            *(ulong *)(psVar14->m_is_match_model + 2) = uVar15;
            *(uint *)&((vector<unsigned_char> *)(psVar14->m_is_match_model + 6))->m_p = uVar7;
            psVar14->m_is_match_model[8].m_bit_0_prob = (uint16)local_3c;
            state_base::save_partial_state
                      (local_28,(state_base *)((long)(psVar14->super_state_base).m_match_hist + 4));
            lzdecision::init((lzdecision *)psVar14,(EVP_PKEY_CTX *)(ulong)local_34);
            (psVar14->super_state_base).m_cur_state = local_cb8;
            in_stack_fffffffffffff278 = local_c60;
            if (local_c60 < psVar14) {
              in_stack_fffffffffffff278 = psVar14;
              local_c60 = psVar14;
            }
          }
        }
      }
      local_c98 = 2;
    }
    local_ccc = local_c94;
    if (local_c94 < (uint)in_RDI[0x87d]) {
      if (1 < uVar10) {
        local_cd0 = 0;
        if ((local_c94 < 2) &&
           (uVar5 = search_accelerator::get_len2_match
                              ((search_accelerator *)in_stack_fffffffffffff258,
                               (uint)((ulong)in_stack_fffffffffffff250 >> 0x20)), uVar5 != 0)) {
          bVar16 = state::get_len2_match_cost
                             ((state *)CONCAT44(uVar19,in_stack_fffffffffffff280),
                              (CLZBase *)in_stack_fffffffffffff278,
                              (uint)((ulong)in_stack_fffffffffffff270 >> 0x20),
                              (uint)in_stack_fffffffffffff270,in_stack_fffffffffffff26c);
          psVar14 = (state *)(psVar11->m_is_rep0_single_byte_model + 2);
          uVar15 = lVar3 + bVar16;
          if ((uVar15 < *(ulong *)(psVar11->m_is_rep1_model + 10)) ||
             ((uVar15 == *(ulong *)(psVar11->m_is_rep1_model + 10) &&
              (iVar1 + 7U < *(uint *)(psVar11->m_is_rep2_model + 2))))) {
            *(ulong *)(psVar11->m_is_rep1_model + 10) = uVar15;
            *(uint *)(psVar11->m_is_rep2_model + 2) = iVar1 + 7U;
            psVar11->m_is_rep2_model[4].m_bit_0_prob = (uint16)local_3c;
            state_base::save_partial_state
                      (local_28,(state_base *)(psVar11->m_is_rep0_single_byte_model + 8));
            lzdecision::init((lzdecision *)psVar14,(EVP_PKEY_CTX *)(ulong)local_34);
            in_stack_fffffffffffff270 = local_c60;
            if (local_c60 < psVar14) {
              in_stack_fffffffffffff270 = psVar14;
              local_c60 = psVar14;
            }
          }
          local_ccc = 2;
        }
        uVar6 = local_ccc;
        local_d00 = search_accelerator::find_matches
                              ((search_accelerator *)in_stack_fffffffffffff258,
                               (uint)((ulong)in_stack_fffffffffffff250 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff250 >> 0x18,0));
        if (local_d00 != (dict_match *)0x0) {
          while( true ) {
            uVar8 = dict_match::get_len(local_d00);
            uVar5 = uVar10;
            if (uVar8 < uVar10) {
              uVar5 = uVar8;
            }
            in_stack_fffffffffffff26c = uVar5;
            if (local_ccc < uVar5) {
              auStack_248[local_cd0] = uVar5;
              uVar8 = dict_match::get_dist(local_d00);
              auStack_448[local_cd0] = uVar8;
              local_cd0 = local_cd0 + 1;
              local_ccc = uVar5;
            }
            bVar4 = dict_match::is_last(local_d00);
            if (bVar4) break;
            local_d00 = local_d00 + 1;
          }
        }
        if (local_cd0 != 0) {
          if (uVar6 < 2) {
            uVar6 = 1;
          }
          local_d08 = uVar6;
          for (local_d0c = 0; in_stack_fffffffffffff268 = uVar6, local_d0c < local_cd0;
              local_d0c = local_d0c + 1) {
            uVar10 = auStack_248[local_d0c];
            in_stack_fffffffffffff238 = uVar10;
            in_stack_fffffffffffff240 = uVar2;
            state::get_full_match_costs
                      (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,dict_pos,in_RDI,uVar19,
                       in_stack_fffffffffffff280,in_stack_fffffffffffff2b0,
                       (uint)in_stack_fffffffffffff2b8);
            while (local_d1c = local_d08 + 1, local_d1c <= uVar10) {
              iVar9 = 7;
              if (8 < local_d1c) {
                iVar9 = 6;
              }
              psVar14 = (state *)((long)&psVar11->super_state_base + (ulong)local_d1c * 0x38);
              uVar15 = lVar3 + local_c58[local_d1c];
              local_d08 = local_d1c;
              if ((uVar15 <= *(ulong *)(psVar14->m_is_match_model + 2)) &&
                 ((uVar15 != *(ulong *)(psVar14->m_is_match_model + 2) ||
                  ((uint)(iVar1 + iVar9) <
                   *(uint *)&((vector<unsigned_char> *)(psVar14->m_is_match_model + 6))->m_p)))) {
                *(ulong *)(psVar14->m_is_match_model + 2) = uVar15;
                *(int *)&((vector<unsigned_char> *)(psVar14->m_is_match_model + 6))->m_p =
                     iVar1 + iVar9;
                psVar14->m_is_match_model[8].m_bit_0_prob = (uint16)local_3c;
                state_base::save_partial_state
                          (local_28,(state_base *)
                                    ((long)(psVar14->super_state_base).m_match_hist + 4));
                lzdecision::init((lzdecision *)psVar14,(EVP_PKEY_CTX *)(ulong)local_34);
                in_stack_fffffffffffff260 = local_c60;
                if (local_c60 < psVar14) {
                  in_stack_fffffffffffff260 = psVar14;
                  local_c60 = psVar14;
                }
              }
            }
            local_d08 = uVar10;
          }
        }
      }
      if (local_ccc < (uint)in_RDI[0x87d]) {
        in_stack_fffffffffffff2c0 =
             state::get_lit_cost(in_stack_fffffffffffff270,
                                 (CLZBase *)
                                 CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                                 (search_accelerator *)in_stack_fffffffffffff260,
                                 (uint)((ulong)in_stack_fffffffffffff258 >> 0x20),
                                 (uint)in_stack_fffffffffffff258,
                                 (uint)((ulong)in_stack_fffffffffffff250 >> 0x20));
        in_stack_fffffffffffff2b8 = lVar3 + in_stack_fffffffffffff2c0;
        in_stack_fffffffffffff2b4 = iVar1 + 1;
        if ((in_stack_fffffffffffff2b8 < *(ulong *)(psVar11->m_is_rep0_model + 6)) ||
           ((in_stack_fffffffffffff2b8 == *(ulong *)(psVar11->m_is_rep0_model + 6) &&
            (in_stack_fffffffffffff2b4 < *(uint *)(psVar11->m_is_rep0_model + 10))))) {
          *(ulong *)(psVar11->m_is_rep0_model + 6) = in_stack_fffffffffffff2b8;
          *(uint *)(psVar11->m_is_rep0_model + 10) = in_stack_fffffffffffff2b4;
          psVar11->m_is_rep0_single_byte_model[0].m_bit_0_prob = (short)local_3c;
          state_base::save_partial_state(local_28,(state_base *)(psVar11->m_is_rep_model + 4));
          lzdecision::init((lzdecision *)(psVar11->m_is_match_model + 10),
                           (EVP_PKEY_CTX *)(ulong)local_34);
          in_stack_fffffffffffff258 = local_c60;
          if (local_c60 < (state *)(psVar11->m_is_match_model + 10)) {
            local_c60 = (state *)(psVar11->m_is_match_model + 10);
            in_stack_fffffffffffff258 = local_c60;
          }
        }
        local_34 = local_34 + 1;
        local_38 = local_38 + 1;
        local_3c = local_3c + 1;
      }
      else {
        local_34 = local_ccc + local_34;
        local_38 = local_ccc + local_38;
        local_3c = local_ccc + local_3c;
      }
    }
    else {
      local_34 = local_c94 + local_34;
      local_38 = local_c94 + local_38;
      local_3c = local_c94 + local_3c;
    }
  }
  uVar10 = local_3c;
  bVar4 = vector<lzham::lzcompressor::lzdecision>::try_reserve
                    ((vector<lzham::lzcompressor::lzdecision> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                     in_stack_fffffffffffff23c);
  grow_hint = (undefined1)(in_stack_fffffffffffff240 >> 0x18);
  if (bVar4) {
    uVar19 = uVar10;
    plVar17 = vector<lzham::lzcompressor::lzdecision>::get_ptr
                        ((vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x559c4));
    do {
      ppvVar18 = (lzham_malloc_context *)
                 ((long)&local_20->super_state_base + (long)(int)uVar10 * 0x38);
      *(lzham_malloc_context *)plVar17 = *ppvVar18;
      plVar17->m_dist = *(int *)(ppvVar18 + 1);
      uVar10 = (uint)*(short *)((long)ppvVar18 + 0x34);
      plVar17 = plVar17 + 1;
    } while (0 < (int)uVar10);
    this_00 = (vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x559c4);
    vector<lzham::lzcompressor::lzdecision>::get_ptr
              ((vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x559c4));
    vector<lzham::lzcompressor::lzdecision>::try_resize_no_construct
              (this_00,in_stack_fffffffffffff244,(bool)grow_hint);
    local_18[0x559d6] = uVar19;
    memset(local_20,0xff,(((long)local_c60 - (long)local_20) / 0x38 + 1) * 0x38);
    local_1 = true;
  }
  else {
    *(undefined1 *)((long)local_18 + 0x15675e) = 1;
    memset(local_20,0xff,(((long)local_c60 - (long)local_20) / 0x38 + 1) * 0x38);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#ifdef LZHAM_BUILD_DEBUG
      for (uint i = 1; i < (cMaxParseGraphNodes + 1); i++)
      {
         LZHAM_ASSERT(pNodes[i].m_total_cost == cUINT64_MAX);
         LZHAM_ASSERT(pNodes[i].m_total_complexity == UINT_MAX);
         LZHAM_ASSERT(pNodes[i].m_parent_index == -1);
      }
#endif

      state &approx_state = *parse_state.m_pState;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node_state *pMax_node_in_graph = &pNodes[0];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         if ((cur_node_index >= parse_state.m_parse_early_out_thresh) && (pCur_node == pMax_node_in_graph))
         {
            // If the best path *must* pass through this node, and we're far enough along, and we're parsing using a single thread, then exit so we can move all our state forward.
            break;
         }

         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxMatchLen), bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;

                  pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
               }
            }

            match_hist_min_match_len = CLZBase::cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= CLZBase::cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               // Get the nearest len2 match if we didn't find a rep len2.
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            // Now get all full matches: the nearest matches at each match length. (Actually, we don't
            // always get the nearest match. The match finder favors those matches which have the lowest value
            // in the nibble of each match distance, all other things being equal, to help exploit how the lowest
            // nibble of match distances is separately coded.)
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(*this, m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);

            pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &pCur_node[1]);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      LZHAM_ASSERT(static_cast<int>(cur_node_index) == (pMax_node_in_graph - pNodes));
      uint bytes_actually_parsed = cur_node_index;

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_actually_parsed))
      {
         parse_state.m_failed = true;

         memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

         LZHAM_LOG_ERROR(7037);

         return false;
      }

      int node_index = bytes_actually_parsed;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize_no_construct(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      parse_state.m_bytes_actually_parsed = bytes_actually_parsed;

      memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

      return true;
   }